

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1515.c
# Opt level: O3

int test(char *URL)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  int *piVar8;
  undefined8 uVar9;
  int iVar10;
  char *pcVar11;
  timeval tVar12;
  int still_running;
  timeval timeout;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  char target_url [256];
  char dns_entry [256];
  int local_3e4;
  char *local_3e0;
  long local_3d8;
  int local_3cc;
  timeval local_3c8;
  fd_set local_3b8;
  fd_set local_338;
  fd_set local_2b8;
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  pcVar1 = libtest_arg3;
  curl_msnprintf(local_138,0x100,"testserver.example.com:%s:%s",libtest_arg3,libtest_arg2);
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar5 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar5,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                  ,0x82,iVar2,uVar3);
    goto LAB_00102a26;
  }
  lVar4 = curl_multi_init();
  if (lVar4 != 0) {
    iVar10 = 1;
    local_3e0 = URL;
    local_3d8 = lVar4;
    do {
      curl_msnprintf(local_238,0x100,"http://testserver.example.com:%s/%s%04d",pcVar1,URL,iVar10);
      uVar5 = curl_slist_append(0,local_138);
      lVar4 = curl_easy_init();
      if (lVar4 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x41);
        iVar2 = 0x7c;
      }
      else {
        iVar2 = curl_easy_setopt(lVar4,0x2712,local_238);
        uVar3 = _stderr;
        if (iVar2 == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x27db,uVar5);
          uVar3 = _stderr;
          if (iVar2 == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x4e7e,debug_callback);
            uVar3 = _stderr;
            if (iVar2 == 0) {
              iVar2 = curl_easy_setopt(lVar4,0x29,1);
              uVar3 = _stderr;
              if (iVar2 == 0) {
                iVar2 = curl_easy_setopt(lVar4,0x5c,1);
                uVar3 = _stderr;
                if (iVar2 == 0) {
                  iVar2 = curl_multi_add_handle(local_3d8,lVar4);
                  uVar3 = _stderr;
                  if (iVar2 == 0) {
                    iVar2 = curl_multi_perform(local_3d8,&local_3e4);
                    uVar3 = _stderr;
                    if (iVar2 == 0) {
                      if (local_3e4 < 0) {
                        pcVar11 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uVar3 = 0x4a;
LAB_00102859:
                        curl_mfprintf(_stderr,pcVar11,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                      ,uVar3);
                        iVar2 = 0x7a;
                      }
                      else {
                        tVar12 = tutil_tvnow();
                        lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                        if (lVar7 < 0xea61) {
                          do {
                            if (local_3e4 == 0) {
                              piVar8 = (int *)curl_multi_info_read(local_3d8,&local_3b8);
                              iVar2 = 0;
                              goto LAB_001028a9;
                            }
                            local_3cc = -99;
                            local_3b8.__fds_bits[0] = 0;
                            local_3b8.__fds_bits[1] = 0;
                            local_3b8.__fds_bits[2] = 0;
                            local_3b8.__fds_bits[3] = 0;
                            local_3b8.__fds_bits[4] = 0;
                            local_3b8.__fds_bits[5] = 0;
                            local_3b8.__fds_bits[6] = 0;
                            local_3b8.__fds_bits[7] = 0;
                            local_3b8.__fds_bits[8] = 0;
                            local_3b8.__fds_bits[9] = 0;
                            local_3b8.__fds_bits[10] = 0;
                            local_3b8.__fds_bits[0xb] = 0;
                            local_3b8.__fds_bits[0xc] = 0;
                            local_3b8.__fds_bits[0xd] = 0;
                            local_3b8.__fds_bits[0xe] = 0;
                            local_3b8.__fds_bits[0xf] = 0;
                            local_2b8.__fds_bits[0] = 0;
                            local_2b8.__fds_bits[1] = 0;
                            local_2b8.__fds_bits[2] = 0;
                            local_2b8.__fds_bits[3] = 0;
                            local_2b8.__fds_bits[4] = 0;
                            local_2b8.__fds_bits[5] = 0;
                            local_2b8.__fds_bits[6] = 0;
                            local_2b8.__fds_bits[7] = 0;
                            local_2b8.__fds_bits[8] = 0;
                            local_2b8.__fds_bits[9] = 0;
                            local_2b8.__fds_bits[10] = 0;
                            local_2b8.__fds_bits[0xb] = 0;
                            local_2b8.__fds_bits[0xc] = 0;
                            local_2b8.__fds_bits[0xd] = 0;
                            local_2b8.__fds_bits[0xe] = 0;
                            local_2b8.__fds_bits[0xf] = 0;
                            local_338.__fds_bits[0xe] = 0;
                            local_338.__fds_bits[0xf] = 0;
                            local_338.__fds_bits[0xc] = 0;
                            local_338.__fds_bits[0xd] = 0;
                            local_338.__fds_bits[10] = 0;
                            local_338.__fds_bits[0xb] = 0;
                            local_338.__fds_bits[8] = 0;
                            local_338.__fds_bits[9] = 0;
                            local_338.__fds_bits[6] = 0;
                            local_338.__fds_bits[7] = 0;
                            local_338.__fds_bits[4] = 0;
                            local_338.__fds_bits[5] = 0;
                            local_338.__fds_bits[2] = 0;
                            local_338.__fds_bits[3] = 0;
                            local_338.__fds_bits[0] = 0;
                            local_338.__fds_bits[1] = 0;
                            local_3c8.tv_sec = 1;
                            local_3c8.tv_usec = 0;
                            iVar2 = curl_multi_fdset(local_3d8,&local_3b8,&local_2b8,&local_338,
                                                     &local_3cc);
                            uVar3 = _stderr;
                            if (iVar2 != 0) {
                              uVar6 = curl_multi_strerror(iVar2);
                              pcVar11 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                              uVar9 = 0x59;
                              goto LAB_001025cd;
                            }
                            if (local_3cc < -1) {
                              pcVar11 = 
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ;
                              uVar3 = 0x59;
                              goto LAB_00102859;
                            }
                            iVar2 = select_wrapper(local_3cc + 1,&local_3b8,&local_2b8,&local_338,
                                                   &local_3c8);
                            if (iVar2 == -1) {
                              piVar8 = __errno_location();
                              uVar3 = _stderr;
                              iVar2 = *piVar8;
                              pcVar11 = strerror(iVar2);
                              URL = local_3e0;
                              curl_mfprintf(uVar3,"%s:%d select() failed, with errno %d (%s)\n",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                            ,0x5a,iVar2,pcVar11);
                              iVar2 = 0x79;
                              goto LAB_001025da;
                            }
                            tVar12 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                            if (60000 < lVar7) {
                              uVar3 = 0x5c;
                              goto LAB_00102887;
                            }
                            iVar2 = curl_multi_perform(local_3d8,&local_3e4);
                            uVar3 = _stderr;
                            if (iVar2 != 0) {
                              uVar6 = curl_multi_strerror(iVar2);
                              pcVar11 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                              uVar9 = 0x5d;
                              goto LAB_001025cd;
                            }
                            if (local_3e4 < 0) {
                              pcVar11 = 
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ;
                              uVar3 = 0x5d;
                              goto LAB_00102859;
                            }
                            tVar12 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                          } while (lVar7 < 0xea61);
                          uVar3 = 0x5f;
                        }
                        else {
                          uVar3 = 0x4c;
                        }
LAB_00102887:
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                      ,uVar3);
                        iVar2 = 0x7d;
                      }
                      goto LAB_001025da;
                    }
                    uVar6 = curl_multi_strerror(iVar2);
                    pcVar11 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                    uVar9 = 0x4a;
                  }
                  else {
                    uVar6 = curl_multi_strerror(iVar2);
                    pcVar11 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                    uVar9 = 0x49;
                  }
                }
                else {
                  uVar6 = curl_easy_strerror(iVar2);
                  pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar9 = 0x47;
                }
              }
              else {
                uVar6 = curl_easy_strerror(iVar2);
                pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar9 = 0x46;
              }
            }
            else {
              uVar6 = curl_easy_strerror(iVar2);
              pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uVar9 = 0x45;
            }
          }
          else {
            uVar6 = curl_easy_strerror(iVar2);
            pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uVar9 = 0x44;
          }
        }
        else {
          uVar6 = curl_easy_strerror(iVar2);
          pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uVar9 = 0x43;
        }
LAB_001025cd:
        URL = local_3e0;
        curl_mfprintf(uVar3,pcVar11,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,uVar9,iVar2,uVar6);
      }
LAB_001025da:
      curl_multi_remove_handle(local_3d8,lVar4);
      curl_easy_cleanup(lVar4);
      curl_slist_free_all(uVar5);
      lVar4 = local_3d8;
      if (iVar2 != 0) goto LAB_00102a1e;
      if (iVar10 == 2) goto LAB_00102a17;
      sleep(2);
      iVar10 = iVar10 + 1;
    } while( true );
  }
  curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                ,0x83);
  iVar2 = 0x7b;
  goto LAB_00102a1e;
LAB_001028a9:
  if (piVar8 == (int *)0x0) goto LAB_001025da;
  if ((*piVar8 == 1) && (*(long *)(piVar8 + 2) == lVar4)) {
    iVar2 = piVar8[4];
    goto LAB_001025da;
  }
  piVar8 = (int *)curl_multi_info_read(local_3d8,&local_3b8);
  goto LAB_001028a9;
LAB_00102a17:
  iVar2 = 0;
LAB_00102a1e:
  curl_multi_cleanup(lVar4);
LAB_00102a26:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  int res = 0;
  char *address = libtest_arg2;
  char *port = libtest_arg3;
  char *path = URL;
  char dns_entry[256];
  int i;
  int count = 2;

  snprintf(dns_entry, sizeof(dns_entry), "testserver.example.com:%s:%s",
           port, address);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);
  multi_init(multi);

  for(i = 1; i <= count; i++) {
    char target_url[256];
    snprintf(target_url, sizeof(target_url),
             "http://testserver.example.com:%s/%s%04d", port, path, i);

    /* second request must succeed like the first one */
    res = do_one_request(multi, target_url, dns_entry);
    if(res)
      goto test_cleanup;

    if(i < count)
      sleep(DNS_TIMEOUT + 1);
  }

test_cleanup:

  curl_multi_cleanup(multi);

  return (int) res;
}